

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.cpp
# Opt level: O3

void ot::commissioner::ComputeBloomFilter(ByteArray *aOut,ByteArray *aIn)

{
  byte *pbVar1;
  uint8_t aByte;
  pointer puVar2;
  uint8_t *puVar3;
  byte bVar4;
  pointer puVar5;
  long lVar6;
  ulong uVar7;
  uint8_t *puVar8;
  Crc16 ansi;
  Crc16 ccitt;
  Crc16 local_40;
  Crc16 local_3c;
  ByteArray *local_38;
  
  Crc16::Crc16(&local_3c,kCcitt);
  Crc16::Crc16(&local_40,kAnsi);
  puVar5 = (aOut->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (aOut->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar6 = (long)puVar2 - (long)puVar5;
  if (lVar6 == 0) {
    __assert_fail("!aOut.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/openthread/bloom_filter.cpp"
                  ,0x37,"void ot::commissioner::ComputeBloomFilter(ByteArray &, const ByteArray &)")
    ;
  }
  uVar7 = ((long)puVar2 - (long)puVar5) * 8;
  if (uVar7 < 0x100) {
    puVar8 = (aIn->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (aIn->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar8 != puVar3) {
      local_38 = aOut;
      do {
        aByte = *puVar8;
        Crc16::Update(&local_3c,aByte);
        Crc16::Update(&local_40,aByte);
        puVar8 = puVar8 + 1;
      } while (puVar8 != puVar3);
      puVar5 = (local_38->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start;
      lVar6 = (long)(local_38->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar5;
      aOut = local_38;
    }
    bVar4 = (byte)((ulong)local_3c.mCrc % uVar7);
    puVar5[(char)~(bVar4 >> 3) + lVar6] =
         puVar5[(char)~(bVar4 >> 3) + lVar6] | '\x01' << (bVar4 & 7);
    bVar4 = (byte)((ulong)local_40.mCrc % uVar7);
    pbVar1 = (aOut->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish + (char)~(bVar4 >> 3);
    *pbVar1 = *pbVar1 | '\x01' << (bVar4 & 7);
    return;
  }
  __assert_fail("numBits <= std::numeric_limits<uint8_t>::max()",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/openthread/bloom_filter.cpp"
                ,0x38,"void ot::commissioner::ComputeBloomFilter(ByteArray &, const ByteArray &)");
}

Assistant:

void ComputeBloomFilter(ByteArray &aOut, const ByteArray &aIn)
{
    Crc16 ccitt(Crc16::Polynomial::kCcitt);
    Crc16 ansi(Crc16::Polynomial::kAnsi);

    const size_t numBits = aOut.size() * 8;

    assert(!aOut.empty());
    assert(numBits <= std::numeric_limits<uint8_t>::max());

    for (auto byte : aIn)
    {
        ccitt.Update(byte);
        ansi.Update(byte);
    }

    SetBit(aOut, ccitt.Get() % numBits);
    SetBit(aOut, ansi.Get() % numBits);
}